

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

int __thiscall
v_hashmap<substring,_features_*>::init(v_hashmap<substring,_features_*> *this,EVP_PKEY_CTX *ctx)

{
  undefined8 in_RCX;
  undefined8 *in_RDX;
  size_t in_stack_000001c8;
  v_array<v_hashmap<substring,_features_*>::hash_elem> *in_stack_000001d0;
  
  v_array<v_hashmap<substring,_features_*>::hash_elem>::resize(in_stack_000001d0,in_stack_000001c8);
  *(undefined8 *)(this + 0x10) = *in_RDX;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = in_RCX;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  return (int)this;
}

Assistant:

void init(size_t min_size, const V& def, bool (*eq)(const K&, const K&))
  {
    if (min_size < 1023)
      min_size = 1023;
    dat.resize(min_size);  // resize sets to 0 ==> occupied=false

    default_value = def;
    equivalent = nullptr;
    equivalent_no_data = eq;
    eq_data = nullptr;

    last_position = 0;
    num_occupants = 0;
  }